

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

uint32_t * gravity_bytecode_deserialize(char *buffer,size_t len,uint32_t *n)

{
  uint uVar1;
  uint32_t *__ptr;
  uint local_48;
  uint local_44;
  uint32_t c;
  uint32_t i;
  uint32_t v;
  uint32_t j;
  uint32_t *bytecode;
  uint32_t ninst;
  uint32_t *n_local;
  size_t len_local;
  char *buffer_local;
  
  uVar1 = (uint)(len >> 3) & 0x1fffffff;
  __ptr = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(uVar1 + 1) << 2);
  i = 0;
  do {
    if (uVar1 <= i) {
      *n = uVar1;
      return __ptr;
    }
    c = 0;
    for (local_44 = i << 3; local_44 <= i * 8 + 7; local_44 = local_44 + 1) {
      local_48 = (uint)buffer[local_44];
      if ((local_48 < 0x41) || (0x46 < local_48)) {
        if ((local_48 < 0x30) || (0x39 < local_48)) {
          *n = 0;
          if (__ptr != (uint32_t *)0x0) {
            free(__ptr);
          }
          return (uint32_t *)0x0;
        }
        local_48 = local_48 - 0x30;
      }
      else {
        local_48 = local_48 - 0x37;
      }
      c = c << 4 | local_48;
    }
    __ptr[i] = c;
    i = i + 1;
  } while( true );
}

Assistant:

uint32_t *gravity_bytecode_deserialize (const char *buffer, size_t len, uint32_t *n) {
    uint32_t ninst = (uint32_t)len / 8;
    uint32_t *bytecode = (uint32_t *)mem_alloc(NULL, sizeof(uint32_t) * (ninst + 1));    // +1 to get a 0 terminated bytecode (0 is opcode RET0)

    for (uint32_t j=0; j<ninst; ++j) {
        register uint32_t v = 0;

        for (uint32_t i=(j*8); i<=(j*8)+7; ++i) {
            // I was using a conversion code from
            // https://code.google.com/p/yara-project/source/browse/trunk/libyara/xtoi.c?r=150
            // but it caused issues under ARM processor so I decided to switch to an easier to read/maintain code
            // http://codereview.stackexchange.com/questions/42976/hexadecimal-to-integer-conversion-function

            // no needs to have also the case:
            // if (c >= 'a' && c <= 'f') {
            //        c = c - 'a' + 10;
            // }
            // because bytecode is always uppercase
            register uint32_t c = buffer[i];

            if (c >= 'A' && c <= 'F') {
                c = c - 'A' + 10;
            } else if (c >= '0' && c <= '9') {
                c -= '0';
            } else goto abort_conversion;

            v = v << 4 | c;

        }

        bytecode[j] = v;
    }

    *n = ninst;
    return bytecode;

abort_conversion:
    *n = 0;
    if (bytecode) mem_free(bytecode);
    return NULL;
}